

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void linenoiseAtExit(void)

{
  linenoiseDisableRawMode(0);
  freeHistory();
  return;
}

Assistant:

static void linenoiseAtExit(void) {
    linenoiseDisableRawMode(STDIN_FILENO);
    freeHistory();
}